

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O2

float deFloat16To32(deFloat16 val16)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  
  uVar5 = CONCAT62(in_register_0000003a,val16);
  uVar1 = (uint)(uVar5 >> 0xf) & 0x1ffff;
  uVar2 = (uint)(uVar5 >> 10) & 0x1f;
  uVar4 = (uint)uVar5 & 0x3ff;
  if (uVar2 == 0x1f) {
    uVar1 = uVar1 << 0x1f;
    if ((val16 & 0x3ff) != 0) {
      uVar1 = uVar1 | (uint)uVar5 << 0xd;
    }
    fVar3 = (float)(uVar1 | 0x7f800000);
  }
  else {
    if ((val16 & 0x7c00) == 0) {
      if ((val16 & 0x3ff) == 0) {
        return (float)(uVar1 << 0x1f);
      }
      uVar2 = 1;
      for (; (uVar4 >> 10 & 1) == 0; uVar4 = uVar4 * 2) {
        uVar2 = uVar2 - 1;
      }
      uVar4 = uVar4 & 0xfffffbff;
    }
    fVar3 = (float)(uVar2 * 0x800000 + 0x38000000 | uVar1 << 0x1f | uVar4 << 0xd);
  }
  return fVar3;
}

Assistant:

float deFloat16To32 (deFloat16 val16)
{
	deUint32 sign;
	deUint32 expotent;
	deUint32 mantissa;
	union
	{
		float		f;
		deUint32	u;
	} x;

	x.u			= 0u;

	sign		= ((deUint32)val16 >> 15u) & 0x00000001u;
	expotent	= ((deUint32)val16 >> 10u) & 0x0000001fu;
	mantissa	= (deUint32)val16 & 0x000003ffu;

	if (expotent == 0u)
	{
		if (mantissa == 0u)
		{
			/* +/- 0 */
			x.u = sign << 31u;
			return x.f;
		}
		else
		{
			/* Denormalized, normalize it. */

			while (!(mantissa & 0x00000400u))
			{
				mantissa <<= 1u;
				expotent -=  1u;
			}

			expotent += 1u;
			mantissa &= ~0x00000400u;
		}
	}
	else if (expotent == 31u)
	{
		if (mantissa == 0u)
		{
			/* +/- InF */
			x.u = (sign << 31u) | 0x7f800000u;
			return x.f;
		}
		else
		{
			/* +/- NaN */
			x.u = (sign << 31u) | 0x7f800000u | (mantissa << 13u);
			return x.f;
		}
	}

	expotent = expotent + (127u - 15u);
	mantissa = mantissa << 13u;

	x.u = (sign << 31u) | (expotent << 23u) | mantissa;
	return x.f;
}